

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptoperator.cpp
# Opt level: O0

void __thiscall ScriptOperator_ToCodeString_Test::TestBody(ScriptOperator_ToCodeString_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_220;
  Message local_218;
  string local_210 [32];
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_7;
  Message local_1d8;
  string local_1d0 [32];
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_6;
  Message local_198;
  string local_190 [32];
  undefined1 local_170 [8];
  AssertionResult gtest_ar_5;
  Message local_158;
  string local_150 [32];
  undefined1 local_130 [8];
  AssertionResult gtest_ar_4;
  Message local_118;
  string local_110 [32];
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  Message local_d8;
  string local_d0 [32];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  Message local_98;
  string local_90 [32];
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_58 [3];
  string local_40 [32];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ScriptOperator_ToCodeString_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_20,"ScriptOperator::OP_MIN.ToCodeString().c_str()","\"OP_MIN\"",
             pcVar2,"OP_MIN");
  std::__cxx11::string::~string(local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_70,"ScriptOperator::OP_3.ToCodeString().c_str()","\"OP_3\"",pcVar2,
             "OP_3");
  std::__cxx11::string::~string(local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_b0,"ScriptOperator::OP_0.ToCodeString().c_str()","\"OP_0\"",pcVar2,
             "OP_0");
  std::__cxx11::string::~string(local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_f0,"ScriptOperator::OP_1.ToCodeString().c_str()","\"OP_1\"",pcVar2,
             "OP_1");
  std::__cxx11::string::~string(local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_130,"ScriptOperator::OP_16.ToCodeString().c_str()","\"OP_16\"",pcVar2
             ,"OP_16");
  std::__cxx11::string::~string(local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_170,"ScriptOperator::OP_TRUE.ToCodeString().c_str()","\"OP_TRUE\"",
             pcVar2,"OP_TRUE");
  std::__cxx11::string::~string(local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1b0,"ScriptOperator::OP_FALSE.ToCodeString().c_str()","\"OP_FALSE\"",
             pcVar2,"OP_FALSE");
  std::__cxx11::string::~string(local_1d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1f0,"ScriptOperator::OP_1NEGATE.ToCodeString().c_str()",
             "\"OP_1NEGATE\"",pcVar2,"OP_1NEGATE");
  std::__cxx11::string::~string(local_210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_220,&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  return;
}

Assistant:

TEST(ScriptOperator, ToCodeString) {
  EXPECT_STREQ(ScriptOperator::OP_MIN.ToCodeString().c_str(), "OP_MIN");
  EXPECT_STREQ(ScriptOperator::OP_3.ToCodeString().c_str(), "OP_3");
  EXPECT_STREQ(ScriptOperator::OP_0.ToCodeString().c_str(), "OP_0");
  EXPECT_STREQ(ScriptOperator::OP_1.ToCodeString().c_str(), "OP_1");
  EXPECT_STREQ(ScriptOperator::OP_16.ToCodeString().c_str(), "OP_16");
  EXPECT_STREQ(ScriptOperator::OP_TRUE.ToCodeString().c_str(), "OP_TRUE");
  EXPECT_STREQ(ScriptOperator::OP_FALSE.ToCodeString().c_str(), "OP_FALSE");
  EXPECT_STREQ(ScriptOperator::OP_1NEGATE.ToCodeString().c_str(), "OP_1NEGATE");
}